

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline_server_transporter.cpp
# Opt level: O1

int __thiscall PipelineServerTransporter::Stop(PipelineServerTransporter *this)

{
  Transporter::Stop(&this->super_Transporter);
  uv_close((uv_handle_t *)&this->uvServer,(uv_close_cb)0x0);
  if (this->uvClient != (uv_pipe_t *)0x0) {
    uv_read_stop((uv_stream_t *)&this->uvClient);
    uv_close((uv_handle_t *)this->uvClient,(uv_close_cb)0x0);
  }
  return 0;
}

Assistant:

int PipelineServerTransporter::Stop() {
	Transporter::Stop();
	uv_close((uv_handle_t*)&uvServer, nullptr);
	if (uvClient) {
		uv_read_stop((uv_stream_t*)&uvClient);
		uv_close((uv_handle_t*)uvClient, nullptr);
	}
	return 0;
}